

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageTimer.cpp
# Opt level: O2

bool __thiscall
helics::MessageTimer::updateTimer(MessageTimer *this,int32_t timerIndex,time_type expirationTime)

{
  action_t aVar1;
  pointer psVar2;
  element_type *peVar3;
  long lVar4;
  epoll_reactor *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor>
  *this_01;
  undefined8 uVar6;
  long *in_FS_OFFSET;
  bool bVar7;
  time_type expirationTime_local;
  type local_78;
  ptr local_60;
  type timerCallback;
  
  expirationTime_local = expirationTime;
  std::mutex::lock(&this->timerLock);
  if ((timerIndex < 0) ||
     (psVar2 = (this->timers).
               super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
     (int)((ulong)((long)(this->timers).
                         super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2) >> 4) <=
     timerIndex)) {
    bVar7 = false;
  }
  else {
    asio::
    basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>
    ::expires_at(psVar2[(uint)timerIndex].
                 super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,&expirationTime_local);
    std::__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<helics::MessageTimer,void>
              ((__shared_ptr<helics::MessageTimer,(__gnu_cxx::_Lock_policy)2> *)&timerCallback,
               (__weak_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2> *)this);
    (this->expirationTimes).
    super__Vector_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_std::allocator<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[(uint)timerIndex].__d.__r =
         (rep)expirationTime_local.__d.__r;
    aVar1 = (this->buffers).
            super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>.
            _M_impl.super__Vector_impl_data._M_start[(uint)timerIndex].messageAction;
    peVar3 = (this->timers).
             super__Vector_base<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>,_std::allocator<std::shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[(uint)timerIndex].
             super___shared_ptr<asio::basic_waitable_timer<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>,_asio::any_io_executor>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    timerCallback.timerIndex = timerIndex;
    std::__shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2> *)&local_78,
               (__shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2> *)&timerCallback);
    local_78.timerIndex = timerCallback.timerIndex;
    lVar4 = *(long *)&peVar3->impl_;
    if (*(long *)(*in_FS_OFFSET + -0x1420) == 0) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x1420) + 8);
    }
    local_60.h = &local_78;
    this_01 = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor>
               *)asio::detail::thread_info_base::
                 allocate<asio::detail::thread_info_base::default_tag>(uVar6,0x80,8);
    local_60.v = this_01;
    asio::detail::wait_op::wait_op
              ((wait_op *)this_01,
               asio::detail::
               wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:131:30),_asio::any_io_executor>
               ::do_complete);
    _Var5._M_pi = local_78.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    local_78.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this_01->handler_).ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = local_78.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    (this_01->handler_).ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var5._M_pi;
    local_78.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this_01->handler_).timerIndex = local_78.timerIndex;
    asio::detail::
    handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>::
    handler_work_base(&(this_01->work_).
                       super_handler_work_base<asio::any_io_executor,_void,_asio::io_context,_asio::executor,_void>
                      ,0,0,(executor_type *)((long)&peVar3->impl_ + 0x40));
    this_00 = *(epoll_reactor **)(lVar4 + 0x58);
    *(bool *)((long)&peVar3->impl_ + 0x10) = true;
    local_60.p = this_01;
    asio::detail::epoll_reactor::
    schedule_timer<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,asio::wait_traits<std::chrono::_V2::steady_clock>>>
              (this_00,(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                        *)(lVar4 + 0x28),(time_type *)((long)&peVar3->impl_ + 8),
               (per_timer_data *)((long)&peVar3->impl_ + 0x18),(wait_op *)this_01);
    local_60.v = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor>
                  *)0x0;
    local_60.p = (wait_handler<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_MessageTimer_cpp:131:30),_asio::any_io_executor>
                  *)0x0;
    asio::detail::
    wait_handler<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/MessageTimer.cpp:131:30),_asio::any_io_executor>
    ::ptr::reset(&local_60);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.ptr.super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    bVar7 = aVar1 != cmd_ignore;
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&timerCallback.ptr.
                super___shared_ptr<helics::MessageTimer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->timerLock);
  return bVar7;
}

Assistant:

bool MessageTimer::updateTimer(int32_t timerIndex, time_type expirationTime)
{
    std::lock_guard<std::mutex> lock(timerLock);
    if ((timerIndex >= 0) && (timerIndex < static_cast<int32_t>(timers.size()))) {
        timers[timerIndex]->expires_at(expirationTime);
        auto timerCallback = [ptr = shared_from_this(), timerIndex](const std::error_code& ec) {
            processTimerCallback(ptr, timerIndex, ec);
        };
        expirationTimes[timerIndex] = expirationTime;
        auto ret = (buffers[timerIndex].action() != CMD_IGNORE);
        timers[timerIndex]->async_wait(timerCallback);
        return ret;
    }
    return false;
}